

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeForces.cpp
# Opt level: O0

void __thiscall OpenMD::FluctuatingChargeForces::initialize(FluctuatingChargeForces *this)

{
  bool bVar1;
  _Rb_tree_const_iterator<OpenMD::AtomType_*> *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  AtomType *in_stack_00000010;
  iterator at;
  AtomType *in_stack_000000f8;
  FluctuatingChargeForces *in_stack_00000100;
  set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_> *this_00;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_const_iterator<OpenMD::AtomType_*> local_18;
  undefined4 in_stack_fffffffffffffff0;
  _Rb_tree_const_iterator<OpenMD::AtomType_*> *__new_size;
  
  __new_size = in_RDI;
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x424faf);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x424fc0);
  this_00 = (set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_> *
            )(in_RDI + 0x19);
  ForceField::getNAtomType((ForceField *)0x424fdc);
  std::vector<int,_std::allocator<int>_>::resize
            (unaff_retaddr,(size_type)__new_size,
             (value_type_conflict1 *)CONCAT44(0xffffffff,in_stack_fffffffffffffff0));
  std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::_Rb_tree_const_iterator(&local_18);
  local_20 = (_Base_ptr)
             std::
             set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::
             begin(this_00);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
         ::end(this_00);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*(in_RDI);
    bVar1 = AtomType::isFluctuatingCharge(in_stack_00000010);
    if (bVar1) {
      std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*(in_RDI);
      addType(in_stack_00000100,in_stack_000000f8);
    }
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator++(in_RDI);
  }
  *(undefined1 *)&in_RDI[0x1f]._M_node = 1;
  return;
}

Assistant:

void FluctuatingChargeForces::initialize() {
    FQtypes.clear();
    FQtids.clear();
    FQtids.resize(forceField_->getNAtomType(), -1);

    AtomTypeSet::iterator at;
    for (at = simTypes_.begin(); at != simTypes_.end(); ++at)
      if ((*at)->isFluctuatingCharge()) addType(*at);

    initialized_ = true;
  }